

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O3

int ffgpv(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *nulval,void *array,
         int *anynul,int *status)

{
  uchar nulval_00;
  char nulval_01;
  unsigned_short nulval_02;
  short nulval_03;
  int nulval_04;
  uint nulval_05;
  unsigned_long nulval_06;
  ULONGLONG nulval_07;
  long nulval_08;
  LONGLONG nulval_09;
  float nulval_10;
  double nulval_11;
  
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        if (nulval == (void *)0x0) {
          nulval_00 = '\0';
        }
        else {
          nulval_00 = *nulval;
        }
        ffgpvb(fptr,1,firstelem,nelem,nulval_00,(uchar *)array,anynul,status);
        goto LAB_00144e54;
      }
      if (datatype == 0xc) {
        if (nulval == (void *)0x0) {
          nulval_01 = '\0';
        }
        else {
          nulval_01 = *nulval;
        }
        ffgpvsb(fptr,1,firstelem,nelem,nulval_01,(char *)array,anynul,status);
        goto LAB_00144e54;
      }
      if (datatype == 0x14) {
        if (nulval == (void *)0x0) {
          nulval_02 = 0;
        }
        else {
          nulval_02 = *nulval;
        }
        ffgpvui(fptr,1,firstelem,nelem,nulval_02,(unsigned_short *)array,anynul,status);
        goto LAB_00144e54;
      }
    }
    else {
      if (datatype == 0x15) {
        if (nulval == (void *)0x0) {
          nulval_03 = 0;
        }
        else {
          nulval_03 = *nulval;
        }
        ffgpvi(fptr,1,firstelem,nelem,nulval_03,(short *)array,anynul,status);
        goto LAB_00144e54;
      }
      if (datatype == 0x1e) {
        if (nulval == (void *)0x0) {
          nulval_05 = 0;
        }
        else {
          nulval_05 = *nulval;
        }
        ffgpvuk(fptr,1,firstelem,nelem,nulval_05,(uint *)array,anynul,status);
        goto LAB_00144e54;
      }
      if (datatype == 0x1f) {
        if (nulval == (void *)0x0) {
          nulval_04 = 0;
        }
        else {
          nulval_04 = *nulval;
        }
        ffgpvk(fptr,1,firstelem,nelem,nulval_04,(int *)array,anynul,status);
        goto LAB_00144e54;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      if (nulval == (void *)0x0) {
        nulval_06 = 0;
      }
      else {
        nulval_06 = *nulval;
      }
      ffgpvuj(fptr,1,firstelem,nelem,nulval_06,(unsigned_long *)array,anynul,status);
      goto LAB_00144e54;
    }
    if (datatype == 0x29) {
      if (nulval == (void *)0x0) {
        nulval_08 = 0;
      }
      else {
        nulval_08 = *nulval;
      }
      ffgpvj(fptr,1,firstelem,nelem,nulval_08,(long *)array,anynul,status);
      goto LAB_00144e54;
    }
    if (datatype == 0x2a) {
      if (nulval == (void *)0x0) {
        nulval_10 = 0.0;
      }
      else {
        nulval_10 = *nulval;
      }
      ffgpve(fptr,1,firstelem,nelem,nulval_10,(float *)array,anynul,status);
      goto LAB_00144e54;
    }
  }
  else {
    if (datatype == 0x50) {
      if (nulval == (void *)0x0) {
        nulval_07 = 0;
      }
      else {
        nulval_07 = *nulval;
      }
      ffgpvujj(fptr,1,firstelem,nelem,nulval_07,(ULONGLONG *)array,anynul,status);
      goto LAB_00144e54;
    }
    if (datatype == 0x51) {
      if (nulval == (void *)0x0) {
        nulval_09 = 0;
      }
      else {
        nulval_09 = *nulval;
      }
      ffgpvjj(fptr,1,firstelem,nelem,nulval_09,(LONGLONG *)array,anynul,status);
      goto LAB_00144e54;
    }
    if (datatype == 0x52) {
      if (nulval == (void *)0x0) {
        nulval_11 = 0.0;
      }
      else {
        nulval_11 = *nulval;
      }
      ffgpvd(fptr,1,firstelem,nelem,nulval_11,(double *)array,anynul,status);
      goto LAB_00144e54;
    }
  }
  *status = 0x19a;
LAB_00144e54:
  return *status;
}

Assistant:

int ffgpv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG firstelem,   /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgpvb(fptr, 1, firstelem, nelem, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgpvb(fptr, 1, firstelem, nelem, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgpvsb(fptr, 1, firstelem, nelem, 0,
               (signed char *) array, anynul, status);
      else
        ffgpvsb(fptr, 1, firstelem, nelem, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgpvui(fptr, 1, firstelem, nelem, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgpvui(fptr, 1, firstelem, nelem, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgpvi(fptr, 1, firstelem, nelem, 0,
               (short *) array, anynul, status);
      else
        ffgpvi(fptr, 1, firstelem, nelem, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgpvuk(fptr, 1, firstelem, nelem, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgpvuk(fptr, 1, firstelem, nelem, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgpvk(fptr, 1, firstelem, nelem, 0,
               (int *) array, anynul, status);
      else
        ffgpvk(fptr, 1, firstelem, nelem, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgpvuj(fptr, 1, firstelem, nelem, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgpvuj(fptr, 1, firstelem, nelem, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgpvj(fptr, 1, firstelem, nelem, 0,
               (long *) array, anynul, status);
      else
        ffgpvj(fptr, 1, firstelem, nelem, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgpvujj(fptr, 1, firstelem, nelem, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgpvujj(fptr, 1, firstelem, nelem, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgpvjj(fptr, 1, firstelem, nelem, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgpvjj(fptr, 1, firstelem, nelem, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgpve(fptr, 1, firstelem, nelem, 0,
               (float *) array, anynul, status);
      else
        ffgpve(fptr, 1, firstelem, nelem, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgpvd(fptr, 1, firstelem, nelem, 0,
               (double *) array, anynul, status);
      else
      {
        ffgpvd(fptr, 1, firstelem, nelem, *(double *) nulval,
               (double *) array, anynul, status);
      }
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}